

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

void __thiscall
DTSStreamReader::checkIfOnlyHDDataExists(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  uint32_t uVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint32_t uVar4;
  uint uVar5;
  int local_4c;
  undefined1 local_48 [4];
  int hdFrameSize;
  BitStreamReader reader;
  bool isHDData;
  int i;
  uint8_t *end_local;
  uint8_t *buff_local;
  DTSStreamReader *this_local;
  
  reader.m_bitLeft = 0;
  end_local = buff;
  while( true ) {
    if (1 < (int)reader.m_bitLeft || end + -4 <= end_local) {
      this->m_isCoreExists = false;
      return;
    }
    uVar1 = *(uint32_t *)end_local;
    uVar4 = my_ntohl(0x64582025);
    reader.m_curVal._3_1_ = uVar1 == uVar4;
    if (!(bool)reader.m_curVal._3_1_) break;
    BitStreamReader::BitStreamReader((BitStreamReader *)local_48);
    BitStreamReader::setBuffer((BitStreamReader *)local_48,end_local + 5,end);
    BitStreamReader::skipBits((BitStreamReader *)local_48,2);
    bVar2 = BitStreamReader::getBit((BitStreamReader *)local_48);
    if (bVar2) {
      BitStreamReader::skipBits((BitStreamReader *)local_48,0xc);
      uVar5 = BitStreamReader::getBits<int>((BitStreamReader *)local_48,0x14);
    }
    else {
      BitStreamReader::skipBits((BitStreamReader *)local_48,8);
      uVar3 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)local_48,0x10);
      uVar5 = (uint)uVar3;
    }
    local_4c = uVar5 + 1;
    end_local = end_local + local_4c;
    reader.m_bitLeft = reader.m_bitLeft + 1;
  }
  return;
}

Assistant:

void DTSStreamReader::checkIfOnlyHDDataExists(uint8_t* buff, const uint8_t* end)
{
    for (int i = 0; i < 2 && buff < end - 4; ++i)
    {
        const bool isHDData = *reinterpret_cast<uint32_t*>(buff) == my_htonl(DTS_HD_PREFIX);
        if (!isHDData)
            return;

        BitStreamReader reader{};
        reader.setBuffer(buff + 5, end);  // skip 4 byte magic and 1 unknown byte
        int hdFrameSize;
        reader.skipBits(2);  // nuSubStreamIndex
        if (reader.getBit())
        {
            reader.skipBits(12);  // headerSize
            hdFrameSize = reader.getBits<int32_t>(20) + 1;
        }
        else
        {
            reader.skipBits(8);  // headerSize
            hdFrameSize = reader.getBits<uint16_t>(16) + 1;
        }
        buff += hdFrameSize;
    }
    m_isCoreExists = false;
}